

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O3

bool __thiscall hwtest::pgraph::MthdSolidFormat::is_valid_val(MthdSolidFormat *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.cls;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((uVar1 & 0xff00) != 0) {
    return uVar2 - 1 < 4;
  }
  return uVar2 != 0 && uVar2 < ((byte)(uVar1 == 0x4b | this->is_new) ^ 5);
}

Assistant:

bool is_valid_val() override {
		if (cls & 0xff00)
			return val < 5 && val != 0;
		return val < (is_new || cls == 0x4b ? 4 : 5) && val != 0;
	}